

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

vrna_param_t * vrna_params(vrna_md_t *md)

{
  double dVar1;
  vrna_md_t *pvVar2;
  vrna_param_t *pvVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  int (*paiVar7) [8];
  int (*paiVar8) [5];
  int (*paaaiVar9) [8] [5] [5];
  int (*paaaaaiVar10) [8] [5] [5] [5] [5];
  int (*paiVar11) [8];
  int (*paaiVar12) [5] [5];
  int (*paiVar13) [5];
  int (*paaaiVar14) [8] [5] [5];
  int (*paaaaiVar15) [8] [5] [5] [5];
  int (*paiVar16) [8];
  int (*paaiVar17) [5] [5];
  int (*paiVar18) [5];
  int (*paaaiVar19) [8] [5] [5];
  int (*paaaaiVar20) [8] [5] [5] [5];
  ulong uVar21;
  vrna_param_t *pvVar22;
  int (*paaaiVar23) [8] [5] [5];
  uint uVar24;
  int (*paaiVar25) [5] [5];
  int (*paaaaiVar26) [8] [5] [5] [5];
  int (*paaiVar27) [5] [5];
  int (*paiVar28) [5];
  long lVar29;
  long lVar30;
  int (*paaiVar31) [5] [5];
  int (*paiVar32) [5];
  int (*paiVar33) [5];
  int (*paaaiVar34) [8] [5] [5];
  int (*paiVar35) [5];
  int (*paaaaiVar36) [8] [5] [5] [5];
  int (*paaaaiVar37) [8] [5] [5] [5];
  int (*paiVar38) [5];
  int (*paaaaaiVar39) [8] [5] [5] [5] [5];
  int (*paiVar40) [5];
  int *piVar41;
  int (*paiVar42) [5];
  int (*paaaaiVar43) [5] [5] [5] [5];
  long lVar44;
  long lVar45;
  int (*paaaaiVar46) [5] [5] [5] [5];
  int iVar47;
  ulong uVar48;
  int (*paaaaiVar49) [8] [5] [5] [5];
  int (*paiVar50) [5];
  int (*paaaaaiVar51) [8] [5] [5] [5] [5];
  vrna_md_t md_1;
  int aiStack_d0 [2];
  vrna_param_t *pvStack_c8;
  int (*paiStack_c0) [5];
  long lStack_b8;
  int (*paiStack_b0) [5];
  vrna_md_t *pvStack_a8;
  int (*paaaaaiStack_a0) [8] [5] [5] [5] [5];
  double dStack_98;
  long lStack_90;
  int (*paiStack_88) [5];
  int (*paiStack_80) [5];
  vrna_param_t *pvStack_78;
  long lStack_70;
  int (*paiStack_68) [5];
  int (*paiStack_60) [5];
  int (*paiStack_58) [5];
  int (*paiStack_50) [5];
  int (*paiStack_48) [5];
  int (*paiStack_40) [5];
  int (*paiStack_38) [5];
  
  if (md == (vrna_md_t *)0x0) {
    vrna_md_set_default((vrna_md_t *)&stack0xfffffffffffff810);
    pvVar3 = get_scaled_params((vrna_md_t *)&stack0xfffffffffffff810);
    return pvVar3;
  }
  aiStack_d0[0] = 0x121707;
  aiStack_d0[1] = 0;
  pvStack_a8 = md;
  pvVar3 = (vrna_param_t *)vrna_alloc(0x33ea8);
  aiStack_d0[0] = 0x121720;
  aiStack_d0[1] = 0;
  memset(pvVar3->param_file,0,0x100);
  aiStack_d0[0] = 0x121725;
  aiStack_d0[1] = 0;
  pcVar4 = last_parameter_file();
  if (pcVar4 != (char *)0x0) {
    aiStack_d0[0] = 0x12172f;
    aiStack_d0[1] = 0;
    pcVar4 = last_parameter_file();
    aiStack_d0[0] = 0x12173f;
    aiStack_d0[1] = 0;
    strncpy(pvVar3->param_file,pcVar4,0xff);
  }
  pvVar2 = pvStack_a8;
  aiStack_d0[0] = 0x121758;
  aiStack_d0[1] = 0;
  memcpy(&pvVar3->model_details,pvStack_a8,0x7e8);
  dVar1 = pvVar2->temperature;
  pvVar3->temperature = dVar1;
  dStack_98 = (dVar1 + 273.15) / Tmeasure;
  pvVar3->ninio[2] = (int)((double)niniodH - (double)(niniodH - ninio37) * dStack_98);
  pvVar3->lxc = lxc37 * dStack_98;
  pvVar3->TripleC = (int)((double)TripleCdH - (double)(TripleCdH - TripleC37) * dStack_98);
  pvVar3->MultipleCA =
       (int)((double)MultipleCAdH - (double)(MultipleCAdH - MultipleCA37) * dStack_98);
  pvVar3->MultipleCB =
       (int)((double)MultipleCBdH - (double)(MultipleCBdH - MultipleCB37) * dStack_98);
  pvVar3->TerminalAU =
       (int)((double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dStack_98);
  pvVar3->DuplexInit =
       (int)((double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dStack_98);
  pvVar3->MLbase = (int)((double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dStack_98);
  pvVar3->PS_penalty = -0x8a;
  pvVar3->PSM_penalty = 0x3ef;
  pvVar3->PSP_penalty = 0x5dc;
  pvVar3->PB_penalty = 0xf6;
  pvVar3->PUP_penalty = 6;
  pvVar3->PPS_penalty = 0x60;
  pvVar3->e_stP_penalty = 0.89;
  pvVar3->e_intP_penalty = 0.74;
  pvVar3->ap_penalty = 0x155;
  pvVar3->bp_penalty = 0x38;
  pvVar3->cp_penalty = 0xc;
  pvVar3->a_penalty = 0x153;
  pvVar3->b_penalty = 3;
  pvVar3->c_penalty = 2;
  pvVar3->MLclosing =
       (int)((double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dStack_98);
  pvVar3->gquadLayerMismatch =
       (int)((double)GQuadLayerMismatchH -
            (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dStack_98);
  pvVar3->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  piVar41 = pvVar3->gquad[2] + 3;
  lVar5 = 2;
  pvStack_c8 = pvVar3;
  do {
    lStack_b8 = CONCAT44(lStack_b8._4_4_,(int)lVar5 + -1);
    uVar21 = 0;
    paaaaaiStack_a0 = (int (*) [8] [5] [5] [5] [5])lVar5;
    do {
      paiStack_c0 = (int (*) [5])
                    ((double)GQuadBetadH - (double)(GQuadBetadH - GQuadBeta37) * dStack_98);
      iVar47 = (int)((double)GQuadAlphadH - (double)(GQuadAlphadH - GQuadAlpha37) * dStack_98) *
               (int)lStack_b8;
      uVar48 = uVar21 + 1;
      aiStack_d0[0] = 0x121a5a;
      aiStack_d0[1] = 0;
      paiStack_b0 = (int (*) [5])uVar21;
      dVar1 = log((double)(uVar48 & 0xffffffff));
      piVar41[(long)paiStack_b0] = (int)(dVar1 * (double)paiStack_c0) + iVar47;
      uVar21 = uVar48;
    } while (uVar48 != 0x2b);
    lVar5 = (long)paaaaaiStack_a0 + 1;
    piVar41 = piVar41 + 0x2e;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    pvStack_c8->hairpin[lVar5] =
         (int)((double)hairpindH[lVar5] - (double)(hairpindH[lVar5] - hairpin37[lVar5]) * dStack_98)
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1f);
  lVar5 = 0;
  do {
    *(int *)((long)pvStack_c8->bulge + lVar5) =
         (int)((double)*(int *)((long)bulgedH + lVar5) -
              (double)(*(int *)((long)bulgedH + lVar5) - *(int *)((long)bulge37 + lVar5)) *
              dStack_98);
    *(int *)((long)pvStack_c8->internal_loop + lVar5) =
         (int)((double)*(int *)((long)internal_loopdH + lVar5) -
              (double)(*(int *)((long)internal_loopdH + lVar5) -
                      *(int *)((long)internal_loop37 + lVar5)) * dStack_98);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x7c);
  if (Tetraloops[0] != '\0') {
    uVar21 = 0;
    uVar24 = 7;
    do {
      pvStack_c8->Tetraloop_E[uVar21] =
           (int)((double)TetraloopdH[uVar21] -
                (double)(TetraloopdH[uVar21] - Tetraloop37[uVar21]) * dStack_98);
      uVar21 = (ulong)((int)uVar21 + 1);
      uVar48 = (ulong)uVar24;
      aiStack_d0[0] = 0x121bcc;
      aiStack_d0[1] = 0;
      sVar6 = strlen(Tetraloops);
      uVar24 = uVar24 + 7;
    } while (uVar48 < sVar6);
  }
  if (Triloops[0] != '\0') {
    uVar21 = 0;
    uVar24 = 5;
    do {
      pvStack_c8->Triloop_E[uVar21] =
           (int)((double)TriloopdH[uVar21] -
                (double)(TriloopdH[uVar21] - Triloop37[uVar21]) * dStack_98);
      uVar21 = (ulong)((int)uVar21 + 1);
      uVar48 = (ulong)uVar24;
      aiStack_d0[0] = 0x121c40;
      aiStack_d0[1] = 0;
      sVar6 = strlen(Triloops);
      uVar24 = uVar24 + 5;
    } while (uVar48 < sVar6);
  }
  if (Hexaloops[0] != '\0') {
    uVar21 = 0;
    uVar24 = 9;
    do {
      pvStack_c8->Hexaloop_E[uVar21] =
           (int)((double)HexaloopdH[uVar21] -
                (double)(HexaloopdH[uVar21] - Hexaloop37[uVar21]) * dStack_98);
      uVar21 = (ulong)((int)uVar21 + 1);
      uVar48 = (ulong)uVar24;
      aiStack_d0[0] = 0x121cb4;
      aiStack_d0[1] = 0;
      sVar6 = strlen(Hexaloops);
      uVar24 = uVar24 + 9;
    } while (uVar48 < sVar6);
  }
  pvVar3 = pvStack_c8;
  lVar5 = 0xc767;
  do {
    *(int *)((long)(pvStack_c8->stack + -1) + 0x1c + lVar5 * 4) =
         (int)((double)ML_interndH - (double)(ML_interndH - ML_intern37) * dStack_98);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc76f);
  paiVar7 = pvStack_c8->stack;
  paiVar11 = stackdH;
  paiVar16 = stack37;
  lVar5 = 0;
  do {
    lVar30 = 0;
    do {
      (*paiVar7)[lVar30] =
           (int)((double)(*paiVar11)[lVar30] -
                (double)((*paiVar11)[lVar30] - (*paiVar16)[lVar30]) * dStack_98);
      lVar30 = lVar30 + 1;
    } while (lVar30 != 8);
    lVar5 = lVar5 + 1;
    paiVar11 = paiVar11 + 1;
    paiVar16 = paiVar16 + 1;
    paiVar7 = paiVar7 + 1;
  } while (lVar5 != 8);
  paaiVar12 = mismatchIdH;
  paaiVar25 = mismatchI37;
  paaiVar17 = mismatchHdH;
  paaiVar27 = mismatchH37;
  paaiVar31 = mismatch1nIdH;
  paiVar8 = mismatch23IdH[0];
  paiVar13 = mismatchExt37[0];
  paiVar18 = mismatch1nI37[0];
  paiVar28 = mismatch23I37[0];
  paiVar32 = mismatchMdH[0];
  paiVar33 = mismatchExtdH[0];
  pvVar22 = pvStack_c8;
  lVar5 = 0;
  paiVar35 = mismatchM37[0];
  do {
    paiStack_58 = paiVar35;
    lStack_70 = lVar5;
    pvStack_78 = pvVar22;
    paiStack_60 = paiVar33;
    paiStack_50 = paiVar32;
    paiStack_48 = paiVar28;
    paiStack_38 = paiVar18;
    paiStack_68 = paiVar13;
    paiStack_40 = paiVar8;
    lVar5 = 0;
    paiVar8 = *paaiVar12;
    paiVar13 = *paaiVar17;
    pvVar22 = pvStack_78;
    paiVar18 = *paaiVar25;
    paiVar28 = *paaiVar27;
    paiVar32 = *paaiVar31;
    paiVar33 = paiStack_38;
    paiVar35 = paiStack_40;
    paiVar38 = paiStack_48;
    paiVar40 = paiStack_50;
    paiVar42 = paiStack_60;
    paiVar50 = paiStack_58;
    paiStack_c0 = paiStack_68;
    do {
      lVar30 = 0;
      do {
        iVar47 = *(int *)((long)*(int (*) [5])*paiVar8 + lVar30);
        *(int *)((long)pvVar22->mismatchI[0][0] + lVar30) =
             (int)((double)iVar47 -
                  (double)(iVar47 - *(int *)((long)*(int (*) [5])*paiVar18 + lVar30)) * dStack_98);
        iVar47 = *(int *)((long)*(int (*) [5])*paiVar13 + lVar30);
        *(int *)((long)pvVar22->mismatchH[0][0] + lVar30) =
             (int)((double)iVar47 -
                  (double)(iVar47 - *(int *)((long)*(int (*) [5])*paiVar28 + lVar30)) * dStack_98);
        iVar47 = *(int *)((long)*(int (*) [5])*paiVar32 + lVar30);
        *(int *)((long)pvVar22->mismatch1nI[0][0] + lVar30) =
             (int)((double)iVar47 -
                  (double)(iVar47 - *(int *)((long)*(int (*) [5])*paiVar33 + lVar30)) * dStack_98);
        iVar47 = *(int *)((long)*(int (*) [5])*paiVar35 + lVar30);
        *(int *)((long)pvVar22->mismatch23I[0][0] + lVar30) =
             (int)((double)iVar47 -
                  (double)(iVar47 - *(int *)((long)*(int (*) [5])*paiVar38 + lVar30)) * dStack_98);
        if (pvStack_a8->dangles == 0) {
          *(undefined4 *)((long)pvVar22->mismatchExt[0][0] + lVar30) = 0;
          uVar24 = 0;
          lVar44 = 0x1218;
        }
        else {
          iVar47 = *(int *)((long)*(int (*) [5])*paiVar40 + lVar30);
          uVar24 = (uint)((double)iVar47 -
                         (double)(iVar47 - *(int *)((long)*(int (*) [5])*paiVar50 + lVar30)) *
                         dStack_98);
          *(uint *)((long)pvVar22->mismatchM[0][0] + lVar30) = (int)uVar24 >> 0x1f & uVar24;
          iVar47 = *(int *)((long)*(int (*) [5])*paiVar42 + lVar30);
          uVar24 = (uint)((double)iVar47 -
                         (double)(iVar47 - *(int *)((long)*(int (*) [5])*paiStack_c0 + lVar30)) *
                         dStack_98);
          uVar24 = (int)uVar24 >> 0x1f & uVar24;
          lVar44 = 0x278;
        }
        *(uint *)((long)(pvVar22->stack + -1) + 0x1c + lVar30 + lVar44) = uVar24;
        lVar30 = lVar30 + 4;
      } while (lVar30 != 0x14);
      lVar5 = lVar5 + 1;
      pvVar22 = (vrna_param_t *)(pvVar22->stack[0] + 4);
      paiVar8 = paiVar8 + 1;
      paiVar18 = paiVar18 + 1;
      paiVar13 = paiVar13 + 1;
      paiVar28 = paiVar28 + 1;
      paiVar32 = paiVar32 + 1;
      paiVar33 = paiVar33 + 1;
      paiVar35 = paiVar35 + 1;
      paiVar38 = paiVar38 + 1;
      paiVar40 = paiVar40 + 1;
      paiVar50 = paiVar50 + 1;
      paiVar42 = paiVar42 + 1;
      paiStack_c0 = paiStack_c0 + 1;
    } while (lVar5 != 5);
    paaiVar12 = (int (*) [5] [5])((long)paaiVar12 + 100);
    paaiVar25 = (int (*) [5] [5])((long)paaiVar25 + 100);
    paaiVar17 = (int (*) [5] [5])((long)paaiVar17 + 100);
    paaiVar27 = (int (*) [5] [5])((long)paaiVar27 + 100);
    paaiVar31 = (int (*) [5] [5])((long)paaiVar31 + 100);
    paiVar8 = paiStack_40 + 5;
    paiVar13 = paiStack_68 + 5;
    paiVar18 = paiStack_38 + 5;
    paiVar28 = paiStack_48 + 5;
    paiVar32 = paiStack_50 + 5;
    paiVar33 = paiStack_60 + 5;
    pvVar22 = (vrna_param_t *)(pvStack_78->stack + 3);
    lVar5 = lStack_70 + 1;
    paiVar35 = paiStack_58 + 5;
  } while (lStack_70 + 1 != 8);
  paiVar8 = pvStack_c8->dangle5;
  paiVar13 = dangle5_dH;
  paiVar18 = dangle5_37;
  paiVar28 = dangle3_dH;
  paiVar32 = dangle3_37;
  lVar5 = 0;
  do {
    lVar30 = 0;
    do {
      iVar47 = *(int *)((long)*paiVar13 + lVar30);
      uVar24 = (uint)((double)iVar47 -
                     (double)(iVar47 - *(int *)((long)*paiVar18 + lVar30)) * dStack_98);
      *(uint *)((long)*paiVar8 + lVar30) = (int)uVar24 >> 0x1f & uVar24;
      iVar47 = *(int *)((long)*paiVar28 + lVar30);
      uVar24 = (uint)((double)iVar47 -
                     (double)(iVar47 - *(int *)((long)*paiVar32 + lVar30)) * dStack_98);
      *(uint *)((long)paiVar8[8] + lVar30) = (int)uVar24 >> 0x1f & uVar24;
      lVar30 = lVar30 + 4;
    } while (lVar30 != 0x14);
    lVar5 = lVar5 + 1;
    paiVar13 = paiVar13 + 1;
    paiVar18 = paiVar18 + 1;
    paiVar8 = paiVar8 + 1;
    paiVar28 = paiVar28 + 1;
    paiVar32 = paiVar32 + 1;
  } while (lVar5 != 8);
  paaaiVar9 = pvStack_c8->int11;
  paaaiVar14 = int11_dH;
  paaaiVar19 = int11_37;
  lVar5 = 0;
  do {
    lVar30 = 0;
    paaaiVar34 = paaaiVar9;
    paiVar8 = (int (*) [5])paaaiVar19;
    paiVar13 = (int (*) [5])paaaiVar14;
    do {
      lVar44 = 0;
      paaaiVar23 = paaaiVar34;
      paiVar28 = paiVar8;
      paiVar18 = paiVar13;
      do {
        lVar45 = 0;
        do {
          iVar47 = (*(int (*) [5] [5])*paiVar18)[0][lVar45];
          (*paaaiVar23)[0][0][lVar45] =
               (int)((double)iVar47 -
                    (double)(iVar47 - (*(int (*) [5] [5])*paiVar28)[0][lVar45]) * dStack_98);
          lVar45 = lVar45 + 1;
        } while (lVar45 != 5);
        lVar44 = lVar44 + 1;
        paiVar18 = paiVar18 + 1;
        paiVar28 = paiVar28 + 1;
        paaaiVar23 = (int (*) [8] [5] [5])((*paaaiVar23)[0] + 1);
      } while (lVar44 != 5);
      lVar30 = lVar30 + 1;
      paiVar13 = paiVar13 + 5;
      paiVar8 = paiVar8 + 5;
      paaaiVar34 = (int (*) [8] [5] [5])(*paaaiVar34 + 1);
    } while (lVar30 != 8);
    lVar5 = lVar5 + 1;
    paaaiVar14 = (int (*) [8] [5] [5])((long)paaaiVar14 + 800);
    paaaiVar19 = (int (*) [8] [5] [5])((long)paaaiVar19 + 800);
    paaaiVar9 = paaaiVar9 + 1;
  } while (lVar5 != 8);
  paaaaiVar36 = pvStack_c8->int21;
  paaaaiVar15 = int21_dH;
  paaaaiVar20 = int21_37;
  lVar5 = 0;
  do {
    lVar30 = 0;
    paiVar8 = (int (*) [5])paaaaiVar15;
    paiVar13 = (int (*) [5])paaaaiVar20;
    paaaaiVar37 = paaaaiVar36;
    do {
      lVar44 = 0;
      paiVar18 = paiVar13;
      paiVar28 = paiVar8;
      paaaaiVar49 = paaaaiVar37;
      do {
        lVar45 = 0;
        paaaaiVar26 = paaaaiVar49;
        paiVar32 = paiVar28;
        paiVar33 = paiVar18;
        do {
          lVar29 = 0;
          do {
            iVar47 = (*(int (*) [5] [5] [5])*paiVar32)[0][0][lVar29];
            (*paaaaiVar26)[0][0][0][lVar29] =
                 (int)((double)iVar47 -
                      (double)(iVar47 - (*(int (*) [5] [5] [5])*paiVar33)[0][0][lVar29]) * dStack_98
                      );
            lVar29 = lVar29 + 1;
          } while (lVar29 != 5);
          lVar45 = lVar45 + 1;
          paiVar32 = paiVar32 + 1;
          paiVar33 = paiVar33 + 1;
          paaaaiVar26 = (int (*) [8] [5] [5] [5])((*paaaaiVar26)[0][0] + 1);
        } while (lVar45 != 5);
        lVar44 = lVar44 + 1;
        paiVar28 = (int (*) [5])(*paiVar28 + 0x19);
        paiVar18 = (int (*) [5])(*paiVar18 + 0x19);
        paaaaiVar49 = (int (*) [8] [5] [5] [5])((*paaaaiVar49)[0] + 1);
      } while (lVar44 != 5);
      lVar30 = lVar30 + 1;
      paiVar8 = paiVar8 + 0x19;
      paiVar13 = paiVar13 + 0x19;
      paaaaiVar37 = (int (*) [8] [5] [5] [5])(*paaaaiVar37 + 1);
    } while (lVar30 != 8);
    lVar5 = lVar5 + 1;
    paaaaiVar15 = (int (*) [8] [5] [5] [5])((long)paaaaiVar15 + 4000);
    paaaaiVar20 = (int (*) [8] [5] [5] [5])((long)paaaaiVar20 + 4000);
    paaaaiVar36 = paaaaiVar36 + 1;
  } while (lVar5 != 8);
  paaaaaiVar10 = pvStack_c8->int22;
  paiVar8 = (int (*) [5])int22_dH;
  paiVar13 = (int (*) [5])int22_37;
  lVar5 = 0;
  do {
    lStack_90 = lVar5;
    paiStack_88 = paiVar13;
    paiStack_80 = paiVar8;
    paaaaaiStack_a0 = paaaaaiVar10;
    paaaaaiVar10 = paaaaaiStack_a0;
    paiVar8 = paiStack_88;
    paiVar13 = paiStack_80;
    lVar5 = 0;
    do {
      lStack_b8 = lVar5;
      paiStack_b0 = paiVar13;
      paiStack_c0 = paiVar8;
      pvStack_a8 = (vrna_md_t *)paaaaaiVar10;
      lVar5 = 0;
      paaaaaiVar10 = (int (*) [8] [5] [5] [5] [5])pvStack_a8;
      paiVar8 = paiStack_b0;
      paiVar13 = paiStack_c0;
      do {
        lVar30 = 0;
        paiVar18 = paiVar8;
        paaaaaiVar39 = paaaaaiVar10;
        paiVar28 = paiVar13;
        do {
          lVar44 = 0;
          paaaaiVar43 = (int (*) [5] [5] [5] [5])paiVar28;
          paaaaiVar46 = (int (*) [5] [5] [5] [5])paiVar18;
          paaaaaiVar51 = paaaaaiVar39;
          do {
            lVar45 = 0;
            do {
              iVar47 = (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar46)[0][0][0][lVar45];
              (*paaaaaiVar51)[0][0][0][0][lVar45] =
                   (int)((double)iVar47 -
                        (double)(iVar47 - (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar43)[0]
                                          [0][0][lVar45]) * dStack_98);
              lVar45 = lVar45 + 1;
            } while (lVar45 != 5);
            lVar44 = lVar44 + 1;
            paaaaiVar46 = (int (*) [5] [5] [5] [5])((long)paaaaiVar46 + 0x14);
            paaaaiVar43 = (int (*) [5] [5] [5] [5])((long)paaaaiVar43 + 0x14);
            paaaaaiVar51 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar51)[0][0][0] + 1);
          } while (lVar44 != 5);
          lVar30 = lVar30 + 1;
          paiVar18 = (int (*) [5])(*paiVar18 + 0x19);
          paiVar28 = (int (*) [5])(*paiVar28 + 0x19);
          paaaaaiVar39 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar39)[0][0] + 1);
        } while (lVar30 != 5);
        lVar5 = lVar5 + 1;
        paiVar8 = paiVar8 + 0x19;
        paiVar13 = paiVar13 + 0x19;
        paaaaaiVar10 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar10)[0] + 1);
      } while (lVar5 != 5);
      paaaaaiVar10 = (int (*) [8] [5] [5] [5] [5])(*(int (*) [8] [5] [5] [5] [5])pvStack_a8 + 1);
      paiVar8 = paiStack_c0 + 0x7d;
      paiVar13 = paiStack_b0 + 0x7d;
      lVar5 = lStack_b8 + 1;
    } while (lStack_b8 + 1 != 8);
    paaaaaiVar10 = paaaaaiStack_a0 + 1;
    paiVar8 = paiStack_80 + 1000;
    paiVar13 = paiStack_88 + 1000;
    lVar5 = lStack_90 + 1;
  } while (lStack_90 + 1 != 8);
  aiStack_d0[0] = 0x12240c;
  aiStack_d0[1] = 0;
  strncpy(pvStack_c8->Tetraloops,Tetraloops,0x119);
  aiStack_d0[0] = 0x122424;
  aiStack_d0[1] = 0;
  strncpy(pvVar3->Triloops,Triloops,0xf1);
  aiStack_d0[0] = 0x12243f;
  aiStack_d0[1] = 0;
  strncpy(pvVar3->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar3->id = id;
  return pvVar3;
}

Assistant:

PUBLIC vrna_param_t *
vrna_params(vrna_md_t *md)
{
  if (md) {
    return get_scaled_params(md);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_scaled_params(&md);
  }
}